

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImGui::RenderCheckMark(ImDrawList *draw_list,ImVec2 pos,ImU32 col,float sz)

{
  ImVector<ImVec2> *this;
  float fVar1;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  float thickness;
  ImVec2 local_80;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  
  fStack_74 = pos.y;
  thickness = sz / 5.0;
  if (thickness <= 1.0) {
    thickness = 1.0;
  }
  fVar1 = sz - thickness * 0.5;
  local_58 = fVar1 / 3.0;
  local_78 = pos.x + thickness * 0.25 + local_58;
  local_38 = -local_58;
  uStack_34 = in_XMM1_Db ^ 0x80000000;
  uStack_30 = in_XMM1_Dc ^ 0x80000000;
  uStack_2c = in_XMM1_Dd ^ 0x80000000;
  local_68 = (fStack_74 + thickness * 0.25 + fVar1) - local_58 * 0.5;
  local_80.y = local_68 - local_58;
  local_80.x = local_78 - local_58;
  this = &draw_list->_Path;
  fStack_64 = fStack_74;
  fStack_60 = fStack_74;
  fStack_5c = fStack_74;
  local_48 = local_78;
  fStack_44 = local_68;
  fStack_40 = fStack_74;
  fStack_3c = fStack_74;
  ImVector<ImVec2>::push_back(this,&local_80);
  local_80.y = local_68;
  local_80.x = local_78;
  ImVector<ImVec2>::push_back(this,&local_80);
  local_80.y = local_38 + local_38 + fStack_44;
  local_80.x = local_58 + local_58 + local_48;
  ImVector<ImVec2>::push_back(this,&local_80);
  ImDrawList::PathStroke(draw_list,col,false,thickness);
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImDrawList* draw_list, ImVec2 pos, ImU32 col, float sz)
{
    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness * 0.5f;
    pos += ImVec2(thickness * 0.25f, thickness * 0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third * 0.5f;
    draw_list->PathLineTo(ImVec2(bx - third, by - third));
    draw_list->PathLineTo(ImVec2(bx, by));
    draw_list->PathLineTo(ImVec2(bx + third * 2.0f, by - third * 2.0f));
    draw_list->PathStroke(col, false, thickness);
}